

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O0

void __thiscall kj::TestCase93::run(TestCase93 *this)

{
  bool bVar1;
  uint *puVar2;
  StringPtr *pSVar3;
  TypeByIndex<2UL,_unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *pTVar4;
  TypeByIndex<3UL,_unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *pTVar5;
  char (*in_R9) [4];
  bool local_261;
  DebugExpression<kj::StringPtr_&> DStack_260;
  bool _kj_shouldLog_7;
  undefined1 local_258 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_7;
  bool local_225;
  int local_224;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int_&> DStack_220;
  undefined1 local_218 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_6;
  DebugExpression<kj::StringPtr_&> DStack_1e8;
  bool _kj_shouldLog_5;
  undefined1 local_1e0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_5;
  bool local_1ad;
  int local_1ac;
  bool _kj_shouldLog_4;
  DebugExpression<unsigned_int_&> DStack_1a8;
  undefined1 local_1a0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_4;
  bool local_161;
  DebugExpression<kj::StringPtr_&> DStack_160;
  bool _kj_shouldLog_3;
  undefined1 local_158 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_3;
  bool local_125;
  int local_124;
  bool _kj_shouldLog_2;
  DebugExpression<unsigned_int_&> DStack_120;
  undefined1 local_118 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_2;
  DebugExpression<kj::StringPtr_&> DStack_e8;
  bool _kj_shouldLog_1;
  undefined1 local_e0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_1;
  bool local_ad;
  int local_ac;
  bool _kj_shouldLog;
  DebugExpression<unsigned_int_&> DStack_a8;
  undefined1 local_a0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  ExpandAndApplyResult<kj::_::MakeRefTupleFunc,_unsigned_int_&,_kj::StringPtr_&,_int,_const_char_(&)[4]>
  local_70;
  undefined1 local_50 [8];
  Tuple<uint_&,_StringPtr_&,_uint,_StringPtr> t;
  StringPtr s;
  uint i;
  TestCase93 *this_local;
  
  s.content.size_._4_4_ = 0x7b;
  StringPtr::StringPtr
            ((StringPtr *)&t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.size_,"foo");
  _kjCondition._36_4_ = 0x141;
  refTuple<unsigned_int&,kj::StringPtr&,int,char_const(&)[4]>
            (&local_70,(kj *)((long)&s.content.size_ + 4),
             (uint *)&t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.size_,
             (StringPtr *)&_kjCondition.field_0x24,(int *)0x91cc8d,in_R9);
  kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>::
  Tuple<unsigned_int&,kj::StringPtr&,int,char_const(&)[4]>
            ((Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr> *)local_50,&local_70);
  puVar2 = get<0ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_a8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,puVar2);
  local_ac = 0x7b;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_a0,
             (DebugExpression<unsigned_int&> *)&stack0xffffffffffffff58,&local_ac);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    local_ad = kj::_::Debug::shouldLog(ERROR);
    while (local_ad != false) {
      puVar2 = get<0ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      _kjCondition_1._36_4_ = 0x7b;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x62,ERROR,
                 "\"failed: expected \" \"(get<0>(t)) == (123)\", _kjCondition, get<0>(t), 123",
                 (char (*) [38])"failed: expected (get<0>(t)) == (123)",
                 (DebugComparison<unsigned_int_&,_int> *)local_a0,puVar2,
                 (int *)&_kjCondition_1.field_0x24);
      local_ad = false;
    }
  }
  pSVar3 = get<1ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_e8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pSVar3);
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_e0,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffff18,(char (*) [4])0x9422c6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      pSVar3 = get<1ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,99,ERROR,
                 "\"failed: expected \" \"(get<1>(t)) == (\\\"foo\\\")\", _kjCondition, get<1>(t), \"foo\""
                 ,(char (*) [40])"failed: expected (get<1>(t)) == (\"foo\")",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_e0,pSVar3,
                 (char (*) [4])0x9422c6);
      _kjCondition_2._39_1_ = 0;
    }
  }
  pTVar4 = get<2ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_120 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pTVar4);
  local_124 = 0x141;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_118,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffee0,&local_124);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
  if (!bVar1) {
    local_125 = kj::_::Debug::shouldLog(ERROR);
    while (local_125 != false) {
      pTVar4 = get<2ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      _kjCondition_3._36_4_ = 0x141;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,100,ERROR,
                 "\"failed: expected \" \"(get<2>(t)) == (321)\", _kjCondition, get<2>(t), 321",
                 (char (*) [38])"failed: expected (get<2>(t)) == (321)",
                 (DebugComparison<unsigned_int_&,_int> *)local_118,pTVar4,
                 (int *)&_kjCondition_3.field_0x24);
      local_125 = false;
    }
  }
  pTVar5 = get<3ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_160 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pTVar5);
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_158,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffea0,(char (*) [4])0x91cc8d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_158);
  if (!bVar1) {
    local_161 = kj::_::Debug::shouldLog(ERROR);
    while (local_161 != false) {
      pTVar5 = get<3ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x65,ERROR,
                 "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
                 ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_158,pTVar5,
                 (char (*) [4])0x91cc8d);
      local_161 = false;
    }
  }
  s.content.size_._4_4_ = 0x1c8;
  StringPtr::StringPtr((StringPtr *)&_kjCondition_4.result,"baz");
  t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.size_ = _kjCondition_4._32_8_;
  puVar2 = get<0ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_1a8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,puVar2);
  local_1ac = 0x1c8;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_1a0,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffe58,&local_1ac);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a0);
  if (!bVar1) {
    local_1ad = kj::_::Debug::shouldLog(ERROR);
    while (local_1ad != false) {
      puVar2 = get<0ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      _kjCondition_5._36_4_ = 0x1c8;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"(get<0>(t)) == (456)\", _kjCondition, get<0>(t), 456",
                 (char (*) [38])"failed: expected (get<0>(t)) == (456)",
                 (DebugComparison<unsigned_int_&,_int> *)local_1a0,puVar2,
                 (int *)&_kjCondition_5.field_0x24);
      local_1ad = false;
    }
  }
  pSVar3 = get<1ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_1e8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pSVar3);
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_1e0,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffe18,(char (*) [4])0x91ea93);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
  if (!bVar1) {
    _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      pSVar3 = get<1ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(get<1>(t)) == (\\\"baz\\\")\", _kjCondition, get<1>(t), \"baz\""
                 ,(char (*) [40])"failed: expected (get<1>(t)) == (\"baz\")",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_1e0,pSVar3,
                 (char (*) [4])0x91ea93);
      _kjCondition_6._39_1_ = 0;
    }
  }
  pTVar4 = get<2ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_220 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pTVar4);
  local_224 = 0x141;
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_int> *)local_218,
             (DebugExpression<unsigned_int&> *)&stack0xfffffffffffffde0,&local_224);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
  if (!bVar1) {
    local_225 = kj::_::Debug::shouldLog(ERROR);
    while (local_225 != false) {
      pTVar4 = get<2ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      _kjCondition_7._36_4_ = 0x141;
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"(get<2>(t)) == (321)\", _kjCondition, get<2>(t), 321",
                 (char (*) [38])"failed: expected (get<2>(t)) == (321)",
                 (DebugComparison<unsigned_int_&,_int> *)local_218,pTVar4,
                 (int *)&_kjCondition_7.field_0x24);
      local_225 = false;
    }
  }
  pTVar5 = get<3ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                     ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                      local_50);
  DStack_260 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,pTVar5);
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_258,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffda0,(char (*) [4])0x91cc8d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_258);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      pTVar5 = get<3ul,kj::_::Tuple<unsigned_int&,kj::StringPtr&,unsigned_int,kj::StringPtr>&>
                         ((Tuple<unsigned_int_&,_kj::StringPtr_&,_unsigned_int,_kj::StringPtr> *)
                          local_50);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
                 ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_258,pTVar5,
                 (char (*) [4])0x91cc8d);
      local_261 = false;
    }
  }
  return;
}

Assistant:

TEST(Tuple, RefTuple) {
  uint i = 123;
  StringPtr s = "foo";

  Tuple<uint&, StringPtr&, uint, StringPtr> t = refTuple(i, s, 321, "bar");
  EXPECT_EQ(get<0>(t), 123);
  EXPECT_EQ(get<1>(t), "foo");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");

  i = 456;
  s = "baz";

  EXPECT_EQ(get<0>(t), 456);
  EXPECT_EQ(get<1>(t), "baz");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");
}